

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.c
# Opt level: O3

void objShiftPtrs(void *obj,ptrdiff_t diff)

{
  long *plVar1;
  void *obj_00;
  ulong uVar2;
  void *pvVar3;
  ulong uVar4;
  
  uVar2 = *(ulong *)((long)obj + 0x10);
  uVar4 = 0;
  if (uVar2 != 0) {
    do {
      obj_00 = *(void **)((long)obj + uVar4 * 8 + 0x18);
      pvVar3 = (void *)((long)obj_00 + diff);
      if ((obj <= pvVar3) && (pvVar3 < (void *)(*obj + (long)obj))) {
        objShiftPtrs(obj_00,diff);
        plVar1 = (long *)((long)obj + uVar4 * 8 + 0x18);
        *plVar1 = *plVar1 + diff;
        uVar2 = *(ulong *)((long)obj + 0x10);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < uVar2);
  }
  uVar2 = *(ulong *)((long)obj + 8);
  for (; uVar4 < uVar2; uVar4 = uVar4 + 1) {
    pvVar3 = (void *)(*(long *)((long)obj + uVar4 * 8 + 0x18) + diff);
    if ((obj <= pvVar3) && (pvVar3 < (void *)(*obj + (long)obj))) {
      *(void **)((long)obj + uVar4 * 8 + 0x18) = pvVar3;
      uVar2 = *(ulong *)((long)obj + 8);
    }
  }
  return;
}

Assistant:

static void objShiftPtrs(void* obj, ptrdiff_t diff)
{
	size_t i;
	// просмотреть объекты
	for (i = 0; i < objOCount(obj); ++i)
		// вложенный объект?
		if ((octet*)obj <= objPtr(obj, i, octet) + diff && 
			objPtr(obj, i, octet) + diff < objEnd(obj, octet))
		{
			objShiftPtrs(objPtr(obj, i, void), diff);
			objPtr(obj, i, octet) += diff;
		}
	// просмотреть оставшиеся указатели
	for (; i < objPCount(obj); ++i)
		// вложенный указатель?
		if ((octet*)obj <= objPtr(obj, i, octet) + diff && 
			objPtr(obj, i, octet) + diff < objEnd(obj, octet))
			objPtr(obj, i, octet) += diff;
}